

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptRegExp::SetProperty
          (JavascriptRegExp *this,JavascriptString *propertyNameString,Var value,
          PropertyOperationFlags flags,PropertyValueInfo *info)

{
  bool bVar1;
  PropertyId propertyId;
  BOOL BVar2;
  ScriptContext *this_00;
  PropertyRecord *local_48;
  PropertyRecord *propertyRecord;
  PropertyValueInfo *pPStack_38;
  BOOL result;
  PropertyValueInfo *info_local;
  Var pvStack_28;
  PropertyOperationFlags flags_local;
  Var value_local;
  JavascriptString *propertyNameString_local;
  JavascriptRegExp *this_local;
  
  pPStack_38 = info;
  info_local._4_4_ = flags;
  pvStack_28 = value;
  value_local = propertyNameString;
  propertyNameString_local = (JavascriptString *)this;
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  ScriptContext::FindPropertyRecord(this_00,(JavascriptString *)value_local,&local_48);
  if (local_48 != (PropertyRecord *)0x0) {
    propertyId = PropertyRecord::GetPropertyId(local_48);
    bVar1 = SetPropertyBuiltIns(this,propertyId,pvStack_28,info_local._4_4_,
                                (BOOL *)((long)&propertyRecord + 4));
    if (bVar1) {
      return propertyRecord._4_4_;
    }
  }
  BVar2 = DynamicObject::SetProperty
                    (&this->super_DynamicObject,(JavascriptString *)value_local,pvStack_28,
                     info_local._4_4_,pPStack_38);
  return BVar2;
}

Assistant:

BOOL JavascriptRegExp::SetProperty(JavascriptString* propertyNameString, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        BOOL result;
        PropertyRecord const * propertyRecord;
        this->GetScriptContext()->FindPropertyRecord(propertyNameString, &propertyRecord);

        if (propertyRecord != nullptr && SetPropertyBuiltIns(propertyRecord->GetPropertyId(), value, flags, &result))
        {
            return result;
        }

        return DynamicObject::SetProperty(propertyNameString, value, flags, info);
    }